

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O3

int __thiscall chrono::utils::Generator::selectIngredient(Generator *this)

{
  double dVar1;
  pointer psVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  if ((rengine()::re == '\0') && (iVar5 = __cxa_guard_acquire(&rengine()::re), iVar5 != 0)) {
    rengine()::re =
         (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)::operator_new(8);
    rengine()::re->_M_x = 1;
    __cxa_guard_release(&rengine()::re);
  }
  dVar8 = std::
          generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                    (rengine()::re);
  dVar1 = (this->m_mixDist)._M_param._M_a;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar1;
  psVar2 = (this->m_mixture).
           super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (ulong)((long)(this->m_mixture).
                        super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2) >> 4;
  uVar7 = uVar6 & 0xffffffff;
  auVar3._8_8_ = extraout_XMM0_Qb;
  auVar3._0_8_ = dVar8;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (this->m_mixDist)._M_param._M_b - dVar1;
  auVar3 = vfmadd213sd_fma(auVar9,auVar3,auVar10);
  do {
    uVar7 = uVar7 - 1;
    if ((int)uVar6 < 1) {
      return 0;
    }
    uVar4 = (int)uVar6 - 1;
    uVar6 = (ulong)uVar4;
  } while (auVar3._0_8_ <=
           (psVar2[uVar7 & 0xffffffff].
            super___shared_ptr<chrono::utils::MixtureIngredient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->m_cumRatio);
  return uVar4;
}

Assistant:

int Generator::selectIngredient() {
    double val = m_mixDist(rengine());

    for (int i = (int)m_mixture.size() - 1; i >= 0; i--) {
        if (val > m_mixture[i]->m_cumRatio)
            return i;
    }

    return 0;
}